

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_task_manager.hpp
# Opt level: O2

void __thiscall
duckdb::BatchTaskManager<duckdb::BatchCopyTask>::AddTask
          (BatchTaskManager<duckdb::BatchCopyTask> *this,
          unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true> *task)

{
  ::std::mutex::lock(&this->task_lock);
  ::std::
  deque<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>,std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>>
            ((deque<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>,std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>>>
              *)&this->task_queue,task);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void AddTask(unique_ptr<TASK> task) {
		lock_guard<mutex> l(task_lock);
		task_queue.push(std::move(task));
	}